

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

ssize_t __thiscall Log::write(Log *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  undefined4 in_register_00000034;
  pointer __dest;
  String *pSVar6;
  
  if ((__buf == (void *)0x0) ||
     (peVar1 = (((Log *)CONCAT44(in_register_00000034,__fd))->mData).
               super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 == (element_type *)0x0)) goto LAB_001441f0;
  sVar4 = __n & 0xffffffff;
  if ((int)__n == -1) {
    sVar4 = strlen((char *)__buf);
  }
  if ((int)sVar4 < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Log.h",
                  0xb4,"Log Log::write(const char *, int)");
  }
  if ((int)sVar4 == 0) goto LAB_001441f0;
  pSVar6 = &peVar1->out;
  if (peVar1->outPtr != (String *)0x0) {
    pSVar6 = peVar1->outPtr;
  }
  sVar2 = (pSVar6->mString)._M_string_length;
  iVar5 = (int)sVar2;
  if (peVar1->disableSpacingOverride == 0) {
    if ((iVar5 == 0) || (peVar1->spacing == false)) goto LAB_001441ca;
    if (sVar2 == 0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",sVar2 - 1,0);
    }
    iVar3 = isspace((int)(pSVar6->mString)._M_dataplus._M_p[sVar2 - 1]);
    if (iVar3 != 0) goto LAB_001441ca;
    iVar3 = isspace((int)*__buf);
    if (iVar3 != 0) goto LAB_001441ca;
    std::__cxx11::string::resize((ulong)pSVar6,(char)sVar4 + (char)sVar2 + '\x01');
    (pSVar6->mString)._M_dataplus._M_p[iVar5] = ' ';
    __dest = (pSVar6->mString)._M_dataplus._M_p + (long)iVar5 + 1;
  }
  else {
    peVar1->disableSpacingOverride = peVar1->disableSpacingOverride + -1;
LAB_001441ca:
    std::__cxx11::string::resize((ulong)pSVar6,(char)sVar4 + (char)sVar2);
    __dest = (pSVar6->mString)._M_dataplus._M_p + iVar5;
  }
  memcpy(__dest,__buf,sVar4 & 0xffffffff);
LAB_001441f0:
  Log(this,(Log *)CONCAT44(in_register_00000034,__fd));
  return (ssize_t)this;
}

Assistant:

Log write(const char *data, int len = -1)
    {
        if (data && mData) {
            if (len == -1)
                len = strlen(data);
            assert(len >= 0);
            if (len) {
                String &str = mData->outPtr ? *mData->outPtr : mData->out;
                const int outLength = str.size();
                if (mData->disableSpacingOverride) {
                    --mData->disableSpacingOverride;
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                } else if (mData->spacing && outLength && !isspace(str.at(str.size() - 1)) && !isspace(*data)) {
                    str.resize(outLength + len + 1);
                    str[outLength] = ' ';
                    memcpy(str.data() + outLength + 1, data, len);
                } else {
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                }
            }
        }
        return *this;
    }